

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O0

set<char,_std::less<char>,_std::allocator<char>_> * __thiscall
burst::make_set<char,std::forward_list<char,std::allocator<char>>const&>
          (set<char,_std::less<char>,_std::allocator<char>_> *__return_storage_ptr__,burst *this,
          forward_list<char,_std::allocator<char>_> *values)

{
  const_iterator __first;
  const_iterator __last;
  forward_list<char,_std::allocator<char>_> *values_local;
  
  __first = std::begin<std::forward_list<char,std::allocator<char>>>
                      ((forward_list<char,_std::allocator<char>_> *)this);
  __last = std::end<std::forward_list<char,std::allocator<char>>>
                     ((forward_list<char,_std::allocator<char>_> *)this);
  std::set<char,std::less<char>,std::allocator<char>>::set<std::_Fwd_list_const_iterator<char>>
            ((set<char,std::less<char>,std::allocator<char>> *)__return_storage_ptr__,
             (_Fwd_list_const_iterator<char>)__first._M_node,
             (_Fwd_list_const_iterator<char>)__last._M_node);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }